

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O2

void __thiscall
MemoryEditor::DrawPreviewData
          (MemoryEditor *this,size_t addr,ImU8 *mem_data,size_t mem_size,ImGuiDataType data_type,
          DataFormat data_format,char *out_buf,size_t out_buf_size)

{
  uint6 uVar1;
  uint uVar2;
  size_t sVar3;
  DataFormat DVar4;
  ImU8 IVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 local_50;
  ImU8 local_48 [8];
  size_t local_40;
  DataFormat local_34;
  
  local_34 = data_format;
  sVar6 = DataTypeGetSize(this,data_type);
  local_40 = mem_size - addr;
  if (sVar6 + addr <= mem_size) {
    local_40 = sVar6;
  }
  if (this->ReadFn == (_func_ImU8_ImU8_ptr_size_t_void_ptr *)0x0) {
    memcpy(local_48,mem_data + addr,local_40);
  }
  else {
    uVar10 = 0;
    uVar9 = 0;
    if (0 < (int)local_40) {
      uVar9 = local_40 & 0xffffffff;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      IVar5 = (*this->ReadFn)(mem_data,addr + uVar10,this->FnUserData);
      local_48[uVar10] = IVar5;
    }
  }
  DVar4 = local_34;
  sVar3 = local_40;
  if (local_34 == DataFormat_Bin) {
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    pcVar7 = FormatBinary(this,(uint8_t *)&local_50,(int)sVar3 << 3);
    pcVar8 = "%s";
    goto LAB_0019a7a7;
  }
  *out_buf = '\0';
  uVar2 = local_50._4_4_;
  uVar1 = local_50._2_6_;
  switch(data_type) {
  case 0:
    local_50 = (char *)((ulong)local_50._1_7_ << 8);
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 == DataFormat_Hex) {
      uVar9 = (ulong)local_50 & 0xff;
      pcVar7 = "0x%02x";
    }
    else {
      if (DVar4 != DataFormat_Dec) goto switchD_0019a3aa_default;
      uVar9 = (ulong)(uint)(int)(char)(uint8_t)local_50;
      pcVar7 = "%hhd";
    }
    break;
  case 1:
    local_50 = (char *)((ulong)local_50._1_7_ << 8);
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 == DataFormat_Dec) {
      pcVar7 = "%hhu";
    }
    else {
      if (DVar4 != DataFormat_Hex) goto switchD_0019a3aa_default;
      pcVar7 = "0x%02x";
    }
    uVar9 = (ulong)local_50 & 0xff;
    break;
  case 2:
    local_50 = (char *)((ulong)uVar1 << 0x10);
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 == DataFormat_Hex) {
      uVar9 = (ulong)local_50 & 0xffff;
      pcVar7 = "0x%04x";
    }
    else {
      if (DVar4 != DataFormat_Dec) goto switchD_0019a3aa_default;
      uVar9 = (ulong)(uint)(int)(short)local_50;
      pcVar7 = "%hd";
    }
    break;
  case 3:
    local_50 = (char *)((ulong)uVar1 << 0x10);
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 == DataFormat_Dec) {
      pcVar7 = "%hu";
    }
    else {
      if (DVar4 != DataFormat_Hex) goto switchD_0019a3aa_default;
      pcVar7 = "0x%04x";
    }
    uVar9 = (ulong)local_50 & 0xffff;
    break;
  case 4:
    local_50 = (char *)((ulong)uVar2 << 0x20);
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 != DataFormat_Hex) {
      if (DVar4 == DataFormat_Dec) {
        uVar9 = (ulong)local_50 & 0xffffffff;
        pcVar7 = "%d";
        break;
      }
      goto switchD_0019a3aa_default;
    }
    goto LAB_0019a788;
  case 5:
    local_50 = (char *)((ulong)uVar2 << 0x20);
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 != DataFormat_Hex) {
      if (DVar4 == DataFormat_Dec) {
        uVar9 = (ulong)local_50 & 0xffffffff;
        pcVar7 = "%u";
        break;
      }
      goto switchD_0019a3aa_default;
    }
LAB_0019a788:
    uVar9 = (ulong)local_50 & 0xffffffff;
    pcVar7 = "0x%08x";
    break;
  case 6:
    local_50 = (char *)0x0;
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 != DataFormat_Hex) {
      if (DVar4 == DataFormat_Dec) {
        pcVar8 = "%lld";
        pcVar7 = local_50;
        goto LAB_0019a7a7;
      }
      goto switchD_0019a3aa_default;
    }
    goto LAB_0019a795;
  case 7:
    local_50 = (char *)0x0;
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 != DataFormat_Hex) {
      if (DVar4 == DataFormat_Dec) {
        pcVar8 = "%llu";
        pcVar7 = local_50;
        goto LAB_0019a7a7;
      }
      goto switchD_0019a3aa_default;
    }
LAB_0019a795:
    pcVar8 = "0x%016llx";
    pcVar7 = local_50;
LAB_0019a7a7:
    snprintf(out_buf,out_buf_size,pcVar8,pcVar7);
    return;
  case 8:
    local_50 = (char *)((ulong)uVar2 << 0x20);
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    if (DVar4 == DataFormat_Dec) {
      pcVar8 = "%f";
    }
    else {
      if (DVar4 != DataFormat_Hex) goto switchD_0019a3aa_default;
      pcVar8 = "%a";
    }
    pcVar7 = (char *)(double)(float)local_50;
    goto LAB_0019a811;
  case 9:
    local_50 = (char *)0x0;
    if (EndianessCopy(void*,void*,unsigned_long)::fp == (code *)0x0) {
      EndianessCopy(void*,void*,unsigned_long)::fp = EndianessCopyBigEndian;
    }
    (*EndianessCopy(void*,void*,unsigned_long)::fp)
              (&local_50,local_48,local_40,this->PreviewEndianess);
    pcVar7 = local_50;
    if (DVar4 == DataFormat_Hex) {
      pcVar8 = "%a";
    }
    else {
      if (DVar4 != DataFormat_Dec) goto switchD_0019a3aa_default;
      pcVar8 = "%f";
    }
LAB_0019a811:
    snprintf(out_buf,out_buf_size,pcVar8,pcVar7);
    return;
  default:
switchD_0019a3aa_default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui_memory_editor/imgui_memory_editor.h"
                  ,0x2e9,
                  "void MemoryEditor::DrawPreviewData(size_t, const ImU8 *, size_t, ImGuiDataType, DataFormat, char *, size_t) const"
                 );
  }
  snprintf(out_buf,out_buf_size,pcVar7,uVar9);
  return;
}

Assistant:

void DrawPreviewData(size_t addr, const ImU8* mem_data, size_t mem_size, ImGuiDataType data_type, DataFormat data_format, char* out_buf, size_t out_buf_size) const
    {
        uint8_t buf[8];
        size_t elem_size = DataTypeGetSize(data_type);
        size_t size = addr + elem_size > mem_size ? mem_size - addr : elem_size;
        if (ReadFn)
            for (int i = 0, n = (int)size; i < n; ++i)
                buf[i] = ReadFn(mem_data, addr + i, FnUserData);
        else
            memcpy(buf, mem_data + addr, size);

        if (data_format == DataFormat_Bin)
        {
            uint8_t binbuf[8];
            EndianessCopy(binbuf, buf, size);
            ImSnprintf(out_buf, out_buf_size, "%s", FormatBinary(binbuf, (int)size * 8));
            return;
        }

        out_buf[0] = 0;
        switch (data_type)
        {
        case ImGuiDataType_S8:
        {
            int8_t int8 = 0;
            EndianessCopy(&int8, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%hhd", int8); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%02x", int8 & 0xFF); return; }
            break;
        }
        case ImGuiDataType_U8:
        {
            uint8_t uint8 = 0;
            EndianessCopy(&uint8, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%hhu", uint8); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%02x", uint8 & 0XFF); return; }
            break;
        }
        case ImGuiDataType_S16:
        {
            int16_t int16 = 0;
            EndianessCopy(&int16, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%hd", int16); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%04x", int16 & 0xFFFF); return; }
            break;
        }
        case ImGuiDataType_U16:
        {
            uint16_t uint16 = 0;
            EndianessCopy(&uint16, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%hu", uint16); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%04x", uint16 & 0xFFFF); return; }
            break;
        }
        case ImGuiDataType_S32:
        {
            int32_t int32 = 0;
            EndianessCopy(&int32, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%d", int32); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%08x", int32); return; }
            break;
        }
        case ImGuiDataType_U32:
        {
            uint32_t uint32 = 0;
            EndianessCopy(&uint32, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%u", uint32); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%08x", uint32); return; }
            break;
        }
        case ImGuiDataType_S64:
        {
            int64_t int64 = 0;
            EndianessCopy(&int64, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%lld", (long long)int64); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%016llx", (long long)int64); return; }
            break;
        }
        case ImGuiDataType_U64:
        {
            uint64_t uint64 = 0;
            EndianessCopy(&uint64, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%llu", (long long)uint64); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%016llx", (long long)uint64); return; }
            break;
        }
        case ImGuiDataType_Float:
        {
            float float32 = 0.0f;
            EndianessCopy(&float32, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%f", float32); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "%a", float32); return; }
            break;
        }
        case ImGuiDataType_Double:
        {
            double float64 = 0.0;
            EndianessCopy(&float64, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%f", float64); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "%a", float64); return; }
            break;
        }
        case ImGuiDataType_COUNT:
            break;
        } // Switch
        IM_ASSERT(0); // Shouldn't reach
    }